

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O0

Reals __thiscall Omega_h::resize_vectors(Omega_h *this,Reals *old_vectors,Int old_dim,Int new_dim)

{
  int size_in;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Reals RVar2;
  Int local_110;
  Write<double> local_e0;
  undefined1 local_d0 [8];
  type f;
  int min_dim;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  Write<double> new_vectors;
  int nv;
  Int new_dim_local;
  Int old_dim_local;
  Reals *old_vectors_local;
  ulong local_10;
  
  if (old_dim == new_dim) {
    Read<double>::Read((Read<double> *)this,(Read<signed_char> *)old_vectors);
    pvVar1 = extraout_RDX;
  }
  else {
    if (((ulong)(old_vectors->write_).shared_alloc_.alloc & 1) == 0) {
      local_10 = ((old_vectors->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_10 = (ulong)(old_vectors->write_).shared_alloc_.alloc >> 3;
    }
    new_vectors.shared_alloc_.direct_ptr._4_4_ =
         divide_no_remainder<int>((int)(local_10 >> 3),old_dim);
    size_in = new_vectors.shared_alloc_.direct_ptr._4_4_ * new_dim;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"",&local_81);
    Write<double>::Write((Write<double> *)local_60,size_in,(string *)local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_110 = old_dim;
    if (new_dim < old_dim) {
      local_110 = new_dim;
    }
    f.old_dim = local_110;
    local_d0._0_4_ = local_110;
    Write<double>::Write((Write<double> *)&f,(Write<double> *)local_60);
    f.new_vectors.shared_alloc_.direct_ptr._0_4_ = new_dim;
    Read<double>::Read((Read<double> *)&f.new_dim,old_vectors);
    f.old_vectors.write_.shared_alloc_.direct_ptr._0_4_ = old_dim;
    parallel_for<Omega_h::resize_vectors(Omega_h::Read<double>,int,int)::__0>
              (new_vectors.shared_alloc_.direct_ptr._4_4_,(type *)local_d0,"resize_vectors");
    Write<double>::Write(&local_e0,(Write<signed_char> *)local_60);
    Read<double>::Read((Read<double> *)this,&local_e0);
    Write<double>::~Write(&local_e0);
    resize_vectors(Omega_h::Read<double>,int,int)::$_0::~__0((__0 *)local_d0);
    Write<double>::~Write((Write<double> *)local_60);
    pvVar1 = extraout_RDX_00;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals resize_vectors(Reals old_vectors, Int old_dim, Int new_dim) {
  if (old_dim == new_dim) return old_vectors;
  auto nv = divide_no_remainder(old_vectors.size(), old_dim);
  Write<Real> new_vectors(nv * new_dim);
  auto min_dim = min2(old_dim, new_dim);
  auto f = OMEGA_H_LAMBDA(Int i) {
    for (Int j = 0; j < min_dim; ++j) {
      new_vectors[i * new_dim + j] = old_vectors[i * old_dim + j];
    }
    for (Int j = min_dim; j < new_dim; ++j) {
      new_vectors[i * new_dim + j] = 0.0;
    }
  };
  parallel_for(nv, f, "resize_vectors");
  return new_vectors;
}